

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderPackingFunctionTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::PackSnorm2x16Case::iterate(PackSnorm2x16Case *this)

{
  ShaderExecutor *pSVar1;
  deUint32 dVar2;
  deInt32 dVar3;
  int iVar4;
  char *pcVar5;
  size_type sVar6;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  reference pvVar9;
  float *pfVar10;
  reference pvVar11;
  float fVar12;
  int local_720;
  int local_71c;
  int local_70c;
  MessageBuilder local_708;
  MessageBuilder local_588;
  Hex<8UL> local_408;
  Hex<8UL> local_400;
  MessageBuilder local_3f8;
  int local_278;
  int local_274;
  int diff1;
  int diff0;
  deUint16 res1;
  deUint16 res0;
  deUint32 res;
  deUint32 ref;
  deUint16 ref1;
  deUint16 ref0;
  int valNdx;
  int numFailed;
  int maxPrints;
  int numValues;
  void *out;
  void *in;
  MessageBuilder local_238;
  Vector<float,_2> local_b4;
  float local_ac;
  float local_a8;
  float y_1;
  float x_1;
  int ndx_1;
  float local_98;
  float local_94;
  float y;
  float x;
  int ndx;
  Vector<float,_2> local_84;
  Vector<float,_2> local_7c;
  Vector<float,_2> local_74 [3];
  Vector<float,_2> local_5c;
  int local_54;
  undefined1 local_50 [4];
  int maxDiff;
  vector<unsigned_int,_std::allocator<unsigned_int>_> outputs;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> inputs;
  Random rnd;
  PackSnorm2x16Case *this_local;
  
  pcVar5 = tcu::TestNode::getName((TestNode *)this);
  dVar2 = deStringHash(pcVar5);
  de::Random::Random((Random *)
                     &inputs.
                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,dVar2 ^ 0x776002);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  if (this->m_precision == PRECISION_HIGHP) {
    local_71c = 1;
  }
  else {
    if (this->m_precision == PRECISION_MEDIUMP) {
      local_720 = 0x21;
    }
    else {
      local_720 = 0;
      if (this->m_precision == PRECISION_LOWP) {
        local_720 = 0x81;
      }
    }
    local_71c = local_720;
  }
  local_54 = local_71c;
  tcu::Vector<float,_2>::Vector(&local_5c,0.0,0.0);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_5c);
  tcu::Vector<float,_2>::Vector(local_74,-1.0,1.0);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,local_74);
  tcu::Vector<float,_2>::Vector(&local_7c,0.5,-0.5);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_7c);
  tcu::Vector<float,_2>::Vector(&local_84,-1.5,1.5);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_84);
  tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&x,0.25,-0.75);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(value_type *)&x);
  for (y = 0.0; (int)y < 0xf; y = (float)((int)y + 1)) {
    fVar12 = de::Random::getFloat
                       ((Random *)
                        &inputs.
                         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_94 = fVar12 * 2.5 + -1.25;
    fVar12 = de::Random::getFloat
                       ((Random *)
                        &inputs.
                         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_98 = fVar12 * 2.5 + -1.25;
    tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&x_1,local_94,local_98);
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
              ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
               &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(value_type *)&x_1);
  }
  for (y_1 = 0.0; (int)y_1 < 0x50; y_1 = (float)((int)y_1 + 1)) {
    fVar12 = de::Random::getFloat
                       ((Random *)
                        &inputs.
                         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_a8 = fVar12 * 1e+06 + -500000.0;
    fVar12 = de::Random::getFloat
                       ((Random *)
                        &inputs.
                         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_ac = fVar12 * 1e+06 + -500000.0;
    tcu::Vector<float,_2>::Vector(&local_b4,local_a8,local_ac);
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
              ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
               &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_b4);
  }
  sVar6 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::size
                    ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                     &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,sVar6);
  pTVar7 = tcu::TestContext::getLog
                     ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_238,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_238,(char (*) [22])"Executing shader for ");
  in = (void *)std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::size
                         ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                          &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(unsigned_long *)&in);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [14])" input values");
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_238);
  out = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                  ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                   &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,0);
  _maxPrints = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,0);
  (*((this->super_ShaderPackingFunctionCase).m_executor)->_vptr_ShaderExecutor[5])();
  pSVar1 = (this->super_ShaderPackingFunctionCase).m_executor;
  sVar6 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::size
                    ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                     &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  (*pSVar1->_vptr_ShaderExecutor[6])(pSVar1,sVar6 & 0xffffffff,&out,&maxPrints);
  sVar6 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::size
                    ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                     &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  numFailed = (int)sVar6;
  valNdx = 10;
  _ref1 = 0;
  for (ref = 0; (int)ref < numFailed; ref = ref + 1) {
    pvVar9 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                       ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                        &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(long)(int)ref);
    pfVar10 = tcu::Vector<float,_2>::x(pvVar9);
    fVar12 = de::clamp<float>(*pfVar10,-1.0,1.0);
    dVar3 = ::deRoundFloatToInt32(fVar12 * 32767.0);
    iVar4 = de::clamp<int>(dVar3,-0x8000,0x7fff);
    res._2_2_ = (ushort)iVar4;
    pvVar9 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                       ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                        &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(long)(int)ref);
    pfVar10 = tcu::Vector<float,_2>::y(pvVar9);
    fVar12 = de::clamp<float>(*pfVar10,-1.0,1.0);
    dVar3 = ::deRoundFloatToInt32(fVar12 * 32767.0);
    iVar4 = de::clamp<int>(dVar3,-0x8000,0x7fff);
    res._0_2_ = (ushort)iVar4;
    _res1 = CONCAT22((ushort)res,res._2_2_);
    pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                         (long)(int)ref);
    diff0 = *pvVar11;
    diff1._2_2_ = (undefined2)diff0;
    diff1._0_2_ = (ushort)((uint)diff0 >> 0x10);
    local_274 = de::abs<int>((uint)res._2_2_ - (diff0 & 0xffffU));
    local_278 = de::abs<int>((uint)(ushort)res - (uint)(ushort)diff1);
    if ((local_54 < local_274) || (local_54 < local_278)) {
      if (_ref1 < 10) {
        pTVar7 = tcu::TestContext::getLog
                           ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_3f8,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (&local_3f8,(char (*) [26])"ERROR: Mismatch in value ");
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(int *)&ref);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [26])", expected packSnorm2x16(");
        pvVar9 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
                 operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             *)&outputs.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(long)(int)ref);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,pvVar9);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [5])0x2bd2712);
        local_400 = tcu::toHex<unsigned_int>(_res1);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_400);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [7])0x2c67b94);
        local_408 = tcu::toHex<unsigned_int>(diff0);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_408);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [13])"\n  diffs = (");
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_274);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_278);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [15])"), max diff = ");
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_54);
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_3f8);
      }
      else if (_ref1 == 10) {
        pTVar7 = tcu::TestContext::getLog
                           ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_588,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<(&local_588,(char (*) [4])0x2b5ff3d);
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_588);
      }
      _ref1 = _ref1 + 1;
    }
  }
  pTVar7 = tcu::TestContext::getLog
                     ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_708,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  local_70c = numFailed - _ref1;
  pMVar8 = tcu::MessageBuilder::operator<<(&local_708,&local_70c);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [4])0x2b9720c);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&numFailed);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [15])" values passed");
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_708);
  pcVar5 = "Result comparison failed";
  if (_ref1 == 0) {
    pcVar5 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,(uint)(_ref1 != 0),pcVar5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  de::Random::~Random((Random *)
                      &inputs.
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		de::Random					rnd			(deStringHash(getName()) ^ 0x776002);
		std::vector<tcu::Vec2>		inputs;
		std::vector<deUint32>		outputs;
		const int					maxDiff		= m_precision == glu::PRECISION_HIGHP	? 1		:		// Rounding only.
												  m_precision == glu::PRECISION_MEDIUMP	? 33	:		// (2^-10) * (2^15) + 1
												  m_precision == glu::PRECISION_LOWP	? 129	: 0;	// (2^-8) * (2^15) + 1

		// Special values to check.
		inputs.push_back(tcu::Vec2(0.0f, 0.0f));
		inputs.push_back(tcu::Vec2(-1.0f, 1.0f));
		inputs.push_back(tcu::Vec2(0.5f, -0.5f));
		inputs.push_back(tcu::Vec2(-1.5f, 1.5f));
		inputs.push_back(tcu::Vec2(0.25f, -0.75f));

		// Random values, mostly in range.
		for (int ndx = 0; ndx < 15; ndx++)
		{
			const float x = rnd.getFloat()*2.5f - 1.25f;
			const float y = rnd.getFloat()*2.5f - 1.25f;
			inputs.push_back(tcu::Vec2(x, y));
		}

		// Large random values.
		for (int ndx = 0; ndx < 80; ndx++)
		{
			const float x = rnd.getFloat()*1e6f - 0.5e6f;
			const float y = rnd.getFloat()*1e6f - 0.5e6f;
			inputs.push_back(tcu::Vec2(x, y));
		}

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->useProgram();
			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < numValues; valNdx++)
			{
				const deUint16	ref0	= (deUint16)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].x(), -1.0f, 1.0f) * 32767.0f), -(1<<15), (1<<15)-1);
				const deUint16	ref1	= (deUint16)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].y(), -1.0f, 1.0f) * 32767.0f), -(1<<15), (1<<15)-1);
				const deUint32	ref		= (ref1 << 16) | ref0;
				const deUint32	res		= outputs[valNdx];
				const deUint16	res0	= (deUint16)(res & 0xffff);
				const deUint16	res1	= (deUint16)(res >> 16);
				const int		diff0	= de::abs((int)ref0 - (int)res0);
				const int		diff1	= de::abs((int)ref1 - (int)res1);

				if (diff0 > maxDiff || diff1 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx
															   << ", expected packSnorm2x16(" << inputs[valNdx] << ") = " << tcu::toHex(ref)
															   << ", got " << tcu::toHex(res)
															   << "\n  diffs = (" << diff0 << ", " << diff1 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			m_testCtx.setTestResult(numFailed == 0 ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									numFailed == 0 ? "Pass"					: "Result comparison failed");
		}

		return STOP;
	}